

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::test_float_output(void)

{
  undefined1 local_19b;
  undefined1 local_19a [2];
  undefined8 local_198 [2];
  float local_188 [2];
  float result;
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [4];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x302e31;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)((long)&reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x8f,"void basic_suite::test_float_output()",local_170,&local_174);
  trial::protocol::json::basic_reader<char>::value<float>((basic_reader<char> *)local_158,local_188)
  ;
  local_198[0] = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("result","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x92,"void basic_suite::test_float_output()",local_188,local_198);
  local_19a[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_19b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x93,"void basic_suite::test_float_output()",local_19a,&local_19b);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void test_float_output()
{
    const char input[] = "1.0";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    float result;
    TRIAL_PROTOCOL_TEST_NO_THROW(reader.value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, 1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}